

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::Builder::MaybeAddFile(Builder *this,Version *v,int level,FileMetaData *f)

{
  VersionSet *pVVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  size_type sVar5;
  reference ppFVar6;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  FileMetaData *f_local;
  Version *pVStack_18;
  int level_local;
  Version *v_local;
  Builder *this_local;
  
  files = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)f;
  f_local._4_4_ = level;
  pVStack_18 = v;
  v_local = (Version *)this;
  sVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (&this->levels_[level].deleted_files,&f->number);
  if (sVar4 == 0) {
    this_00 = pVStack_18->files_ + f_local._4_4_;
    if ((0 < f_local._4_4_) &&
       (bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                empty(this_00), !bVar2)) {
      pVVar1 = this->vset_;
      sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (this_00);
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this_00,sVar5 - 1);
      iVar3 = InternalKeyComparator::Compare
                        (&pVVar1->icmp_,&(*ppFVar6)->largest,(InternalKey *)(files + 1));
      if (-1 < iVar3) {
        __assert_fail("vset_->icmp_.Compare((*files)[files->size() - 1]->largest, f->smallest) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                      ,0x2d5,
                      "void leveldb::VersionSet::Builder::MaybeAddFile(Version *, int, FileMetaData *)"
                     );
      }
    }
    *(int *)&(files->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(files->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
              (this_00,(value_type *)&files);
  }
  return;
}

Assistant:

void MaybeAddFile(Version* v, int level, FileMetaData* f) {
    if (levels_[level].deleted_files.count(f->number) > 0) {
      // File is deleted: do nothing
    } else {
      std::vector<FileMetaData*>* files = &v->files_[level];
      if (level > 0 && !files->empty()) {
        // Must not overlap
        assert(vset_->icmp_.Compare((*files)[files->size() - 1]->largest,
                                    f->smallest) < 0);
      }
      f->refs++;
      files->push_back(f);
    }
  }